

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  ModuleFieldList *pMVar1;
  SharedValidator *this_00;
  anon_union_16_2_ecfd7102_for_Location_1 *rhs;
  ModuleFieldType *loc;
  TypeEntryKind TVar2;
  ExternalKind kind;
  Module *this_01;
  TypeEntry *base;
  Type *pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  Type *result_types;
  pointer pFVar6;
  Import *base_00;
  Type elem_type;
  ModuleField *pMVar7;
  ModuleField *pMVar8;
  pointer ppMVar9;
  TypeMut field_00;
  bool bVar10;
  Index IVar11;
  Result RVar12;
  reference pMVar13;
  FuncType *pFVar14;
  StructType *pSVar15;
  ArrayType *pAVar16;
  FuncImport *pFVar17;
  TagImport *pTVar18;
  MemoryImport *pMVar19;
  GlobalImport *pGVar20;
  TableImport *pTVar21;
  const_reference pvVar22;
  RefTypeExpr<(wabt::ExprType)37> *pRVar23;
  VarExpr<(wabt::ExprType)36> *pVVar24;
  Location *pLVar25;
  Type type;
  intrusive_list<wabt::Expr> *elem_expr;
  Var *__return_storage_ptr__;
  ModuleField *pMVar26;
  Location *loc_00;
  char **this_02;
  Field *field;
  pointer pFVar27;
  const_iterator rhs_00;
  const_iterator rhs_01;
  const_iterator rhs_02;
  const_iterator rhs_03;
  const_iterator rhs_04;
  const_iterator rhs_05;
  const_iterator rhs_06;
  const_iterator rhs_07;
  const_iterator rhs_08;
  const_iterator rhs_09;
  const_iterator rhs_10;
  const_iterator rhs_11;
  string_view name;
  ModuleFieldList *__range2;
  const_iterator __begin2;
  TypeMut local_338;
  TypeMutVector type_muts;
  Var local_2b8;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  this_01 = this->current_module_;
  pMVar1 = &this_01->fields;
  __begin2.node_ = (this_01->fields).first_;
  this_00 = &this->validator_;
  __begin2.list_ = pMVar1;
  while( true ) {
    rhs_00.node_ = (ModuleField *)0x0;
    rhs_00.list_ = pMVar1;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_00);
    if (!bVar10) break;
    pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
    if (pMVar13->type_ == Type) {
      base = (TypeEntry *)pMVar13[1]._vptr_ModuleField;
      TVar2 = base->kind_;
      if (TVar2 == Array) {
        pAVar16 = cast<wabt::ArrayType,wabt::TypeEntry>(base);
        field_00.type = (pAVar16->field).type;
        field_00.mutable_ = (pAVar16->field).mutable_;
        field_00._9_3_ = *(undefined3 *)&(pAVar16->field).field_0x29;
        RVar12 = SharedValidator::OnArrayType(this_00,&pMVar13->loc,field_00);
LAB_0013e2e0:
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
      }
      else if (TVar2 == Struct) {
        pSVar15 = cast<wabt::StructType,wabt::TypeEntry>(base);
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pFVar6 = (pSVar15->fields).super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar27 = (pSVar15->fields).
                       super__Vector_base<wabt::Field,_std::allocator<wabt::Field>_>._M_impl.
                       super__Vector_impl_data._M_start; pFVar27 != pFVar6; pFVar27 = pFVar27 + 1) {
          local_338.type = pFVar27->type;
          local_338.mutable_ = pFVar27->mutable_;
          std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::emplace_back<wabt::TypeMut>
                    ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)
                     &type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>,
                     &local_338);
        }
        RVar12 = SharedValidator::OnStructType
                           (this_00,&pMVar13->loc,
                            (Index)(((long)type_muts.
                                           super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)type_muts.
                                          super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0xc),
                            type_muts.
                            super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        std::_Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~_Vector_base
                  (&type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>);
      }
      else if (TVar2 == Func) {
        pFVar14 = cast<wabt::FuncType,wabt::TypeEntry>(base);
        pTVar3 = (pFVar14->sig).param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar4 = (pFVar14->sig).param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pTVar5 = (pFVar14->sig).result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        result_types = (pFVar14->sig).result_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
        IVar11 = Module::GetFuncTypeIndex(this_01,&pFVar14->sig);
        RVar12 = SharedValidator::OnFuncType
                           (this_00,&pMVar13->loc,(Index)((ulong)((long)pTVar4 - (long)pTVar3) >> 3)
                            ,pTVar3,(Index)((ulong)((long)pTVar5 - (long)result_types) >> 3),
                            result_types,IVar11);
        goto LAB_0013e2e0;
      }
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
  }
  type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
  type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pMVar1;
  do {
    rhs_01.node_ = (ModuleField *)0x0;
    rhs_01.list_ = pMVar1;
    bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                       ((const_iterator *)&type_muts,rhs_01);
    if (!bVar10) {
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_02.node_ = (ModuleField *)0x0, rhs_02.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_02), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Func) {
          GetFuncTypeIndex(&local_108,this,&pMVar13->loc,
                           (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
          RVar12 = SharedValidator::OnFunction(this_00,&pMVar13->loc,&local_108);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_108);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_03.node_ = (ModuleField *)0x0, rhs_03.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_03), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Table) {
          elem_type.enum_ = pMVar13[1].type_;
          elem_type.type_index_ = *(Index *)&pMVar13[1].field_0x3c;
          RVar12 = SharedValidator::OnTable
                             (this_00,&pMVar13->loc,elem_type,
                              (Limits *)&pMVar13[1].loc.filename._M_str);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_04.node_ = (ModuleField *)0x0, rhs_04.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_04), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Memory) {
          RVar12 = SharedValidator::OnMemory
                             (this_00,&pMVar13->loc,(Limits *)&pMVar13[1].loc.filename._M_str);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      __begin2.node_ = pMVar1->first_;
      __begin2.list_ = pMVar1;
      while (rhs_05.node_ = (ModuleField *)0x0, rhs_05.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_05)
            , bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar13->type_ == Global) {
          RVar12 = SharedValidator::OnGlobal
                             (this_00,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str,
                              (bool)pMVar13[1].loc.field_1.field2[0]);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          RVar12 = SharedValidator::BeginInitExpr
                             (this_00,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
          RVar12 = ExprVisitor::VisitExprList
                             ((ExprVisitor *)&type_muts,
                              (ExprList *)((long)&pMVar13[1].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          RVar12 = SharedValidator::EndInitExpr(this_00);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_06.node_ = (ModuleField *)0x0, rhs_06.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_06), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Tag) {
          GetFuncTypeIndex(&local_150,this,&pMVar13->loc,
                           (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
          RVar12 = SharedValidator::OnTag(this_00,&pMVar13->loc,&local_150);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_150);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_07.node_ = (ModuleField *)0x0, rhs_07.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_07), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Export) {
          kind = *(ExternalKind *)&pMVar13[1].loc.filename._M_str;
          Var::Var(&local_198,(Var *)&pMVar13[1].loc.field_1.field_0);
          name._M_str = (char *)pMVar13[1]._vptr_ModuleField;
          name._M_len = (size_t)pMVar13[1].super_intrusive_list_base<wabt::ModuleField>.next_;
          RVar12 = SharedValidator::OnExport(this_00,&pMVar13->loc,kind,&local_198,name);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_198);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pMVar1->first_;
      type_muts.super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar1;
      while (rhs_08.node_ = (ModuleField *)0x0, rhs_08.list_ = pMVar1,
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                               ((const_iterator *)&type_muts,rhs_08), bVar10) {
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                            ((const_iterator *)&type_muts);
        if (pMVar13->type_ == Start) {
          Var::Var(&local_1e0,(Var *)(pMVar13 + 1));
          RVar12 = SharedValidator::OnStart(this_00,&pMVar13->loc,&local_1e0);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_1e0);
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
      }
      __begin2.node_ = pMVar1->first_;
      __begin2.list_ = pMVar1;
      do {
        rhs_09.node_ = (ModuleField *)0x0;
        rhs_09.list_ = pMVar1;
        bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_09);
        if (!bVar10) {
          SharedValidator::OnDataCount
                    (this_00,(Index)((ulong)((long)(this_01->data_segments).
                                                                                                      
                                                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this_01->data_segments).
                                                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
          IVar11 = this_01->num_func_imports;
          __begin2.node_ = (this_01->fields).first_;
          __begin2.list_ = pMVar1;
          while( true ) {
            rhs_10.node_ = (ModuleField *)0x0;
            rhs_10.list_ = pMVar1;
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_10)
            ;
            if (!bVar10) break;
            pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
            if (pMVar13->type_ == Func) {
              loc = &pMVar13[6].type_;
              this_02 = &pMVar13[6].loc.filename._M_str;
              pLVar25 = (Location *)loc;
              if (*(long *)((long)&pMVar13[6].loc.field_1 + 8) != 0) {
                pvVar22 = intrusive_list<wabt::Expr>::back((intrusive_list<wabt::Expr> *)this_02);
                pLVar25 = &pvVar22->loc;
              }
              RVar12 = SharedValidator::BeginFunctionBody(this_00,(Location *)loc,IVar11);
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              pMVar7 = (ModuleField *)pMVar13[5].loc.filename._M_len;
              for (pMVar26 = pMVar13[5].super_intrusive_list_base<wabt::ModuleField>.prev_;
                  pMVar26 != pMVar7;
                  pMVar26 = (ModuleField *)
                            ((long)&(pMVar26->super_intrusive_list_base<wabt::ModuleField>).next_ +
                            4)) {
                RVar12 = SharedValidator::OnLocalDecl
                                   (this_00,(Location *)loc,
                                    *(Index *)&(pMVar26->
                                               super_intrusive_list_base<wabt::ModuleField>).next_,
                                    (Type)pMVar26->_vptr_ModuleField);
                (this->result_).enum_ =
                     (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              }
              IVar11 = IVar11 + 1;
              ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
              RVar12 = ExprVisitor::VisitExprList((ExprVisitor *)&type_muts,(ExprList *)this_02);
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              RVar12 = SharedValidator::EndFunctionBody(this_00,pLVar25);
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
            }
            intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
          }
          __begin2.node_ = (this_01->fields).first_;
          __begin2.list_ = pMVar1;
          while( true ) {
            rhs_11.node_ = (ModuleField *)0x0;
            rhs_11.list_ = pMVar1;
            bVar10 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=(&__begin2,rhs_11)
            ;
            if (!bVar10) break;
            pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
            if (pMVar13->type_ == DataSegment) {
              rhs = &pMVar13[1].loc.field_1;
              Var::Var(&local_2b8,(Var *)&rhs->field_0);
              RVar12 = SharedValidator::OnDataSegment
                                 (this_00,&pMVar13->loc,&local_2b8,
                                  *(SegmentKind *)&pMVar13[1]._vptr_ModuleField);
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              Var::~Var(&local_2b8);
              if (pMVar13[3]._vptr_ModuleField != (_func_int **)0x0) {
                IVar11 = Module::GetMemoryIndex(this_01,(Var *)&rhs->field_0);
                ppMVar9 = (this_01->memories).
                          super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                type.enum_ = I32;
                type.type_index_ = 0xffffffff;
                if ((ulong)IVar11 <
                    (ulong)((long)(this_01->memories).
                                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar9 >> 3))
                {
                  type = (Type)~(ulong)(ppMVar9[IVar11]->page_limits).is_64;
                }
                RVar12 = SharedValidator::BeginInitExpr(this_00,&pMVar13->loc,type);
                (this->result_).enum_ =
                     (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
                ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
                RVar12 = ExprVisitor::VisitExprList
                                   ((ExprVisitor *)&type_muts,
                                    (ExprList *)((long)&pMVar13[2].loc.field_1 + 8));
                (this->result_).enum_ =
                     (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
                RVar12 = SharedValidator::EndInitExpr(this_00);
                (this->result_).enum_ =
                     (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
                ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
              }
            }
            intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
          }
          RVar12 = SharedValidator::EndModule(this_00);
          RVar12.enum_._0_1_ = RVar12.enum_ == Error || (this->result_).enum_ == Error;
          RVar12.enum_._1_3_ = 0;
          (this->result_).enum_ = RVar12.enum_;
          return (Result)RVar12.enum_;
        }
        pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*(&__begin2);
        if (pMVar13->type_ == ElemSegment) {
          pLVar25 = &pMVar13->loc;
          Var::Var(&local_228,(Var *)&pMVar13[1].loc.field_1.field_0);
          RVar12 = SharedValidator::OnElemSegment
                             (this_00,pLVar25,&local_228,
                              *(SegmentKind *)&pMVar13[1]._vptr_ModuleField);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          Var::~Var(&local_228);
          RVar12 = SharedValidator::OnElemSegmentElemType
                             (this_00,pLVar25,*(Type *)((long)&pMVar13[2].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          if (pMVar13[3].super_intrusive_list_base<wabt::ModuleField>.next_ != (ModuleField *)0x0) {
            RVar12 = SharedValidator::BeginInitExpr(this_00,pLVar25,(Type)0xffffffffffffffff);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::ExprVisitor((ExprVisitor *)&type_muts,&this->super_Delegate);
            RVar12 = ExprVisitor::VisitExprList
                               ((ExprVisitor *)&type_muts,(ExprList *)&pMVar13[2].type_);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            RVar12 = SharedValidator::EndInitExpr(this_00);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            ExprVisitor::~ExprVisitor((ExprVisitor *)&type_muts);
          }
          pMVar7 = (ModuleField *)pMVar13[3].loc.filename._M_len;
          for (pMVar26 = pMVar13[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
              pMVar26 != pMVar7; pMVar26 = (ModuleField *)&pMVar26->loc) {
            pMVar8 = (pMVar26->super_intrusive_list_base<wabt::ModuleField>).prev_;
            if (pMVar8 != (ModuleField *)0x0) {
              loc_00 = pLVar25;
              if (pMVar8 == (ModuleField *)0x1) {
                pvVar22 = intrusive_list<wabt::Expr>::front((intrusive_list<wabt::Expr> *)pMVar26);
                loc_00 = &pvVar22->loc;
                if (pvVar22->type_ == RefFunc) {
                  pVVar24 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(pvVar22);
                  Var::Var(&local_270,&pVVar24->var);
                  RVar12 = SharedValidator::OnElemSegmentElemExpr_RefFunc(this_00,loc_00,&local_270)
                  ;
                  (this->result_).enum_ =
                       (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
                  Var::~Var(&local_270);
                  goto LAB_0013eaf4;
                }
                if (pvVar22->type_ != RefNull) goto LAB_0013ead4;
                pRVar23 = cast<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Expr>(pvVar22);
                RVar12 = SharedValidator::OnElemSegmentElemExpr_RefNull
                                   (this_00,loc_00,pRVar23->type);
              }
              else {
LAB_0013ead4:
                RVar12 = SharedValidator::OnElemSegmentElemExpr_Other(this_00,loc_00);
              }
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            }
LAB_0013eaf4:
          }
        }
        intrusive_list<wabt::ModuleField>::const_iterator::operator++(&__begin2);
      } while( true );
    }
    pMVar13 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&type_muts);
    if (pMVar13->type_ != Import) goto switchD_0013e363_default;
    base_00 = (Import *)pMVar13[1]._vptr_ModuleField;
    switch(base_00->kind_) {
    case First:
      pFVar17 = cast<wabt::FuncImport,wabt::Import>(base_00);
      __return_storage_ptr__ = &local_78;
      GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar13->loc,&(pFVar17->func).decl);
      RVar12 = SharedValidator::OnFunction(this_00,&pMVar13->loc,__return_storage_ptr__);
      goto LAB_0013e3cd;
    case Table:
      pTVar21 = cast<wabt::TableImport,wabt::Import>(base_00);
      RVar12 = SharedValidator::OnTable
                         (this_00,&pMVar13->loc,(pTVar21->table).elem_type,
                          &(pTVar21->table).elem_limits);
      break;
    case Memory:
      pMVar19 = cast<wabt::MemoryImport,wabt::Import>(base_00);
      RVar12 = SharedValidator::OnMemory(this_00,&pMVar13->loc,&(pMVar19->memory).page_limits);
      break;
    case Global:
      pGVar20 = cast<wabt::GlobalImport,wabt::Import>(base_00);
      RVar12 = SharedValidator::OnGlobalImport
                         (this_00,&pMVar13->loc,(pGVar20->global).type,(pGVar20->global).mutable_);
      break;
    case Last:
      pTVar18 = cast<wabt::TagImport,wabt::Import>(base_00);
      __return_storage_ptr__ = &local_c0;
      GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar13->loc,&(pTVar18->tag).decl);
      RVar12 = SharedValidator::OnTag(this_00,&pMVar13->loc,__return_storage_ptr__);
LAB_0013e3cd:
      (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
      Var::~Var(__return_storage_ptr__);
    default:
      goto switchD_0013e363_default;
    }
    (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
switchD_0013e363_default:
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&type_muts);
  } while( true );
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(
              field.loc, func_type->sig.param_types.size(),
              func_type->sig.param_types.data(),
              func_type->sig.result_types.size(),
              func_type->sig.result_types.data(),
              module->GetFuncTypeIndex(func_type->sig));
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Tag: {
          auto&& tag = cast<TagImport>(f->import.get())->tag;
          result_ |= validator_.OnTag(field.loc,
                                      GetFuncTypeIndex(field.loc, tag.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      // Init expr.
      result_ |= validator_.BeginInitExpr(field.loc, f->global.type);
      ExprVisitor visitor(this);
      result_ |=
          visitor.VisitExprList(const_cast<ExprList&>(f->global.init_expr));
      result_ |= validator_.EndInitExpr();
    }
  }

  // Tag section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TagModuleField>(&field)) {
      result_ |=
          validator_.OnTag(field.loc, GetFuncTypeIndex(field.loc, f->tag.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      result_ |= validator_.OnElemSegmentElemType(field.loc,
                                                  f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.offset.size()) {
        result_ |= validator_.BeginInitExpr(field.loc, Type::I32);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->elem_segment.offset));
        result_ |= validator_.EndInitExpr();
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        if (elem_expr.size() == 1) {
          const Expr* expr = &elem_expr.front();
          switch (expr->type()) {
            case ExprType::RefNull:
              result_ |= validator_.OnElemSegmentElemExpr_RefNull(
                  expr->loc, cast<RefNullExpr>(expr)->type);
              break;
            case ExprType::RefFunc:
              result_ |= validator_.OnElemSegmentElemExpr_RefFunc(
                  expr->loc, cast<RefFuncExpr>(expr)->var);
              break;
            default:
              result_ |= validator_.OnElemSegmentElemExpr_Other(expr->loc);
              break;
          }
        } else if (elem_expr.size() > 1) {
          result_ |= validator_.OnElemSegmentElemExpr_Other(field.loc);
        }
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      const Location& body_start = f->func.loc;
      const Location& body_end =
          f->func.exprs.empty() ? body_start : f->func.exprs.back().loc;
      result_ |= validator_.BeginFunctionBody(body_start, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        result_ |= validator_.OnLocalDecl(body_start, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(body_end);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(field.loc, f->data_segment.memory_var,
                                          f->data_segment.kind);

      // Init expr.
      if (f->data_segment.offset.size()) {
        Type offset_type = Type::I32;
        Index memory_index = module->GetMemoryIndex(f->data_segment.memory_var);
        if (memory_index < module->memories.size() &&
            module->memories[memory_index]->page_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->data_segment.offset));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}